

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON__UINT32 __thiscall
ON_XMLNode::ReadFromStream
          (ON_XMLNode *this,wchar_t *stream,bool bWarningsAsErrors,bool bValidateTags)

{
  ON_XMLNodePrivate *this_00;
  ON_XMLPropertyPrivate *this_01;
  CPropertyData *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  wchar_t *pwVar5;
  undefined4 extraout_var;
  ON_XMLNode *this_02;
  ON_XMLProperty *this_03;
  ON_XMLVariant *this_04;
  ON__UINT32 OVar6;
  ulong uVar7;
  ON_wString sDefaultProperty;
  ON_wString tag;
  ON_wString local_158;
  ON_wString local_150;
  wchar_t *local_148;
  wchar_t *local_140;
  ON_wString local_138;
  uint local_12c;
  ON_XMLVariant local_128;
  undefined4 extraout_var_00;
  
  if (stream == (wchar_t *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xd8e,"","Stream cannot be null");
    OVar6 = 0xffffffff;
  }
  else {
    if (bWarningsAsErrors) {
      g_iWarningsFlagCounter = g_iWarningsFlagCounter + 1;
    }
    (*this->_vptr_ON_XMLNode[0x14])(this);
    local_148 = stream;
    ON_wString::ON_wString(&local_150);
    bVar2 = ON_XMLNodePrivate::GetNextTag(&local_150,&local_148,bValidateTags);
    OVar6 = 0xffffffff;
    if (bVar2) {
      bVar2 = ON_wString::IsEmpty(&local_150);
      if (!bVar2) {
        this_00 = this->_private;
        this_00->m_last_read_buf_ptr = stream;
        ON_XMLNodePrivate::GetPropertiesFromTag(this_00,&local_150);
        iVar3 = ON_wString::Length(&local_150);
        pwVar5 = ON_wString::operator[](&local_150,iVar3 + -2);
        if (*pwVar5 == L'/') {
LAB_00685151:
          iVar3 = (*this->_vptr_ON_XMLNode[9])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 200))
                    ((long *)CONCAT44(extraout_var,iVar3),this);
          uVar7 = (long)local_148 - (long)stream;
          for (pwVar5 = local_148; (*pwVar5 == L'\r' || (*pwVar5 == L'\n')); pwVar5 = pwVar5 + 1) {
            uVar7 = uVar7 + 4;
          }
          OVar6 = (ON__UINT32)(uVar7 >> 2);
        }
        else {
          ON_wString::ON_wString(&local_158);
          local_12c = (uint)bWarningsAsErrors;
          while( true ) {
            iVar3 = 0;
            pwVar5 = local_148;
            while( true ) {
              local_140 = local_148;
              if (*pwVar5 == L'\0') goto LAB_006852c9;
              if (*pwVar5 == L'<') break;
              pwVar5 = pwVar5 + 1;
              iVar3 = iVar3 + 1;
            }
            ON_REMOVE_ASAP_AssertEx
                      (1,
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                       ,0xdc2,"","*start == L\'<\' is false");
            if (*pwVar5 == L'<') {
              ON_wString::Append(&local_158,local_140,iVar3);
            }
            local_148 = pwVar5;
            bVar2 = ON_XMLNodePrivate::GetNextTag(&local_150,&local_148,bValidateTags);
            if (!bVar2) break;
            bVar2 = ON_XMLNodePrivate::IsClosingTag(this->_private,&local_150);
            if (bVar2) {
              ON_wString::TrimLeft(&local_158,(wchar_t *)0x0);
              ON_wString::TrimRight(&local_158,(wchar_t *)0x0);
              DecodeXML(&local_158);
              bVar2 = ON_wString::IsEmpty(&local_158);
              if (!bVar2) {
                this_03 = (ON_XMLProperty *)operator_new(0x68);
                ON_XMLProperty::ON_XMLProperty(this_03);
                (*this->_vptr_ON_XMLNode[0xc])(this,this_03);
                if (ON_XMLNodePrivate::m_bAutoTypePropValue == true) {
                  iVar3 = ON_wString::Find(&local_158,L":");
                  if (0 < iVar3) {
                    iVar3 = (*this_03->_vptr_ON_XMLProperty[9])(this_03);
                    this_04 = (ON_XMLVariant *)CONCAT44(extraout_var_00,iVar3);
                    ON_wString::Mid(&local_138,(int)&local_158);
                    ::ON_XMLVariant::ON_XMLVariant(&local_128,&local_138);
                    ::ON_XMLVariant::operator=(this_04,&local_128);
                    ::ON_XMLVariant::~ON_XMLVariant(&local_128);
                    ON_wString::~ON_wString(&local_138);
                    (*this_04->_vptr_ON_XMLVariant[0x2f])(this_04,1);
                    goto LAB_00685413;
                  }
                }
                ON_XMLPropertyPrivate::SetHugeStringValue(this_03->_private,&local_158);
                this_01 = this_03->_private;
                ON_XMLPropertyPrivate::CopyOnWrite(this_01);
                pCVar1 = this_01->_data;
                (*(pCVar1->m_value)._vptr_ON_XMLVariant[0x2f])(&pCVar1->m_value,1);
              }
LAB_00685413:
              ON_wString::~ON_wString(&local_158);
              goto LAB_00685151;
            }
            this_02 = (ON_XMLNode *)operator_new(0xe8);
            pwVar5 = local_140;
            ON_XMLNode(this_02,L"");
            (*this->_vptr_ON_XMLNode[0xb])(this,this_02);
            uVar4 = (*this_02->_vptr_ON_XMLNode[0x17])
                              (this_02,pwVar5,(ulong)local_12c,bValidateTags);
            if (uVar4 == 0xffffffff) break;
            local_148 = local_140 + uVar4;
          }
LAB_006852c9:
          ON_wString::~ON_wString(&local_158);
        }
      }
    }
    ON_wString::~ON_wString(&local_150);
    if (bWarningsAsErrors) {
      g_iWarningsFlagCounter = g_iWarningsFlagCounter + -1;
    }
  }
  return OVar6;
}

Assistant:

ON__UINT32 ON_XMLNode::ReadFromStream(const wchar_t* stream, bool bWarningsAsErrors, bool bValidateTags)
{
  if (nullptr == stream)
  {
    ON_ERROR("Stream cannot be null");
    return ReadError;
  }

  CWarningHelper wh(bWarningsAsErrors);

  Clear();

  // Search for the opening tag "<" character.
  wchar_t* pBuffer = const_cast<wchar_t*>(stream);

  ON_wString tag;

  // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
  // The original code was not checking GetNextTag() for failure and blindly continuing with an empty tag.
  // Then in some places it assumed that the tag was not empty. This is confusing because I thought
  // this was causing RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
  if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
    return ReadError;

  if (tag.IsEmpty())
    return ReadError;

  _private->m_last_read_buf_ptr = (void*)stream;

  _private->GetPropertiesFromTag(tag);

  const auto pos1 = tag.Length() - 2; // Assumes the tag is not empty.
  if (tag[pos1] != L'/')
  {
    // This tag either has children, or a default property.
    ON_wString sDefaultProperty;

    bool bClosingTag = false;
    do
    {
      auto* pStoreBuffer = pBuffer;

      // Get anything between the tags and store as the default parameter.
      auto* start = pBuffer;
      while ((*start != L'<') && (*start != 0))
      {
        start++;
      }

      if (0 == *start)
      {
        // We ran off the end of the buffer - no idea why, but this is bad, so fail.
        // See http://mcneel.myjetbrains.com/youtrack/issue/RH-16605 for example.
        return ReadError;
      }

      ON_ASSERT(*start == L'<');

      if (nullptr != start && *start == L'<')
      {
        sDefaultProperty.Append(pBuffer, (int)(start - pBuffer));
      }

      pBuffer = start;

      // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
      // The original code was not checking GetNextTag() for failure and blindly continuing with
      // an empty tag. This caused continuous child recursion because the buffer pointer was
      // still pointing at the same (bad) XML. This is confusing because I thought this was causing
      // RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
      if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
        return ReadError;

      bClosingTag = _private->IsClosingTag(tag);

      if (!bClosingTag)
      {
        auto* pNode = new ON_XMLNode(L"");
        AttachChildNode(pNode);

        const auto read = pNode->ReadFromStream(pStoreBuffer, bWarningsAsErrors, bValidateTags);
        if (ReadError == read)
          return ReadError;

        pBuffer = pStoreBuffer + read;
      }
    }
    while (!bClosingTag);

    sDefaultProperty.TrimLeft();
    sDefaultProperty.TrimRight();
    DecodeXML(sDefaultProperty);

    if (!sDefaultProperty.IsEmpty())
    {
      auto* pProp = new ON_XMLProperty;
      AttachProperty(pProp);

      const int pos2 = ON_XMLNodePrivate::m_bAutoTypePropValue ? sDefaultProperty.Find(L":") : -1;
      if (pos2 > 0)
      {
        auto& v = pProp->GetNonConstValue();
        v = sDefaultProperty.Mid(pos2 + 1);
        v.SetTypePendingFlag(true);
      }
      else
      {
        pProp->_private->SetHugeStringValue(sDefaultProperty);
        pProp->_private->GetNonConstValue().SetTypePendingFlag(true);
      }
    }
  }

  TopLevel().OnNodeReadFromStream(this);

  while ((*pBuffer == L'\r') || (*pBuffer == L'\n'))
    pBuffer++;

  return ON__UINT32(pBuffer - stream);
}